

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

LY_ERR plugins_insert(ly_ctx *ctx,LYPLG type,void *recs)

{
  LY_ERR LVar1;
  lyplg_ext_record *rec;
  uint32_t i;
  ulong uVar2;
  ly_set *plVar3;
  
  if (recs == (void *)0x0) {
    LVar1 = LY_SUCCESS;
  }
  else if (type == LYPLG_EXTENSION) {
    plVar3 = &plugins_extensions;
    if (ctx != (ly_ctx *)0x0) {
      plVar3 = &ctx->plugins_extensions;
    }
    uVar2 = 0;
    do {
      if (*(long *)((long)recs + uVar2 * 0x70 + 0x10) == 0) {
        return LY_SUCCESS;
      }
      LVar1 = ly_set_add(plVar3,(void *)(uVar2 * 0x70 + (long)recs),'\0',(uint32_t *)0x0);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (LVar1 == LY_SUCCESS);
  }
  else {
    plVar3 = &plugins_types;
    if (ctx != (ly_ctx *)0x0) {
      plVar3 = &ctx->plugins_types;
    }
    uVar2 = 0;
    do {
      if (*(long *)((long)recs + uVar2 * 0x60 + 0x10) == 0) {
        return LY_SUCCESS;
      }
      LVar1 = ly_set_add(plVar3,(void *)(uVar2 * 0x60 + (long)recs),'\0',(uint32_t *)0x0);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (LVar1 == LY_SUCCESS);
  }
  return LVar1;
}

Assistant:

static LY_ERR
plugins_insert(struct ly_ctx *ctx, enum LYPLG type, const void *recs)
{
    struct ly_set *plugins;

    if (!recs) {
        return LY_SUCCESS;
    }

    if (type == LYPLG_EXTENSION) {
        const struct lyplg_ext_record *rec = (const struct lyplg_ext_record *)recs;

        plugins = ctx ? &ctx->plugins_extensions : &plugins_extensions;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    } else { /* LYPLG_TYPE */
        const struct lyplg_type_record *rec = (const struct lyplg_type_record *)recs;

        plugins = ctx ? &ctx->plugins_types : &plugins_types;

        for (uint32_t i = 0; rec[i].name; i++) {
            LY_CHECK_RET(ly_set_add(plugins, (void *)&rec[i], 0, NULL));
        }
    }

    return LY_SUCCESS;
}